

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void entityDeclDebug(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                    xmlChar *content)

{
  xmlChar *nullstr;
  xmllintState *lint;
  xmlChar *content_local;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  int type_local;
  xmlChar *name_local;
  void *ctx_local;
  
  systemId_local = publicId;
  if (publicId == (xmlChar *)0x0) {
    systemId_local = "(null)";
  }
  content_local = systemId;
  if (systemId == (xmlChar *)0x0) {
    content_local = "(null)";
  }
  lint = (xmllintState *)content;
  if (content == (xmlChar *)0x0) {
    lint = (xmllintState *)anon_var_dwarf_998;
  }
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) == 0) {
    fprintf(_stdout,"SAX.entityDecl(%s, %d, %s, %s, %s)\n",name,(ulong)(uint)type,systemId_local,
            content_local,lint);
  }
  return;
}

Assistant:

static void
entityDeclDebug(void *ctx, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
    xmllintState *lint = ctx;
    const xmlChar *nullstr = BAD_CAST "(null)";

    /* not all libraries handle printing null pointers nicely */
    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (content == NULL)
        content = (xmlChar *)nullstr;
    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.entityDecl(%s, %d, %s, %s, %s)\n",
            name, type, publicId, systemId, content);
}